

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O1

bool __thiscall nuraft::raft_server::request_append_entries(raft_server *this,ptr<peer> *p)

{
  atomic<bool> *paVar1;
  atomic<int> *paVar2;
  char cVar3;
  context *pcVar4;
  element_type *peVar5;
  element_type *peVar6;
  __int_type_conflict _Var7;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar9;
  ReturnCode RVar10;
  int32 iVar11;
  int iVar12;
  size_t sVar13;
  size_t sVar14;
  uint64_t uVar15;
  snapshot_io_mgr *psVar16;
  long lVar17;
  element_type *peVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  byte bVar21;
  ptr<raft_params> clone;
  ptr<raft_params> params;
  Param param;
  Param cb_param;
  _Any_data local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Any_data local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ptr<req_msg> local_a8;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  int32 local_88;
  __int_type_conflict1 _Stack_84;
  int32 iStack_80;
  undefined4 uStack_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Type local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  element_type *local_38;
  
  bVar21 = 0;
  if ((request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer == '\0') &&
     (iVar12 = __cxa_guard_acquire(&request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer
                                  ), iVar12 != 0)) {
    request_append_entries::chk_timer.t_created_.__d.__r = (duration)0;
    request_append_entries::chk_timer.duration_us_ = 1000000;
    request_append_entries::chk_timer.first_event_fired_ = true;
    request_append_entries::chk_timer.lock_.super___mutex_base._M_mutex.__align = 0;
    request_append_entries::chk_timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
    request_append_entries::chk_timer.lock_.super___mutex_base._M_mutex._16_8_ = 0;
    request_append_entries::chk_timer.lock_.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    request_append_entries::chk_timer.lock_.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    timer_helper::reset(&request_append_entries::chk_timer);
    __cxa_guard_release(&request_append_entries(std::shared_ptr<nuraft::peer>)::chk_timer);
  }
  if ((this->role_)._M_i != leader) {
    return false;
  }
  local_48 = this->id_;
  local_44 = (this->leader_).super___atomic_base<int>._M_i;
  local_40 = ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->config_).
              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_;
  local_38 = (element_type *)0x0;
  pcVar4 = (this->ctx_)._M_t.
           super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
           super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
           super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
  if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
    local_c8._0_4_ = 7;
    local_e8._M_unused._M_object = &stack0xffffffffffffffb8;
    RVar10 = (*(pcVar4->cb_func_).func._M_invoker)
                       ((_Any_data *)&pcVar4->cb_func_,(Type *)local_c8._M_pod_data,
                        (Param **)&local_e8);
    if (RVar10 == ReturnNull) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar5 == (element_type *)0x0) {
        return true;
      }
      iVar12 = (*peVar5->_vptr_logger[7])();
      if (iVar12 < 3) {
        return true;
      }
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_((string *)&local_e8,"by callback, abort request_append_entries");
      (*peVar5->_vptr_logger[8])
                (peVar5,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0x9a,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_unused._0_8_ == &local_d8) {
        return true;
      }
      operator_delete(local_e8._M_unused._M_object);
      return true;
    }
  }
  context::get_params((context *)&stack0xffffffffffffff68);
  if (((*(char *)((long)&local_98[10]._vptr_state_mgr + 2) == '\x01') &&
      (iVar11 = get_num_voting_members(this), iVar11 == 2)) &&
     (bVar9 = timer_helper::timeout_and_reset(&request_append_entries::chk_timer), bVar9)) {
    sVar13 = get_not_responding_peers(this);
    iVar11 = get_quorum_for_commit(this);
    sVar14 = get_num_stale_peers(this);
    if (iVar11 == 0) {
      if ((sVar14 != 0 || sVar13 != 0) || (*(int *)&local_98[7]._vptr_state_mgr != 1))
      goto LAB_00211abb;
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&local_e8,
                   "2-node cluster\'s follower is responding now, restore quorum with default value"
                  );
        (*peVar5->_vptr_logger[8])
                  (peVar5,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0xbf,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_unused._0_8_ != &local_d8) {
          operator_delete(local_e8._M_unused._M_object);
        }
      }
      peVar18 = local_98;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = operator_new(0x78);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0061eba8;
      local_e8._M_unused._0_8_ = (undefined8)(local_e8._8_8_ + 0x10);
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_unused._0_8_;
      for (lVar17 = 0x1a; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined4 *)paVar19 = *(undefined4 *)&peVar18->_vptr_state_mgr;
        peVar18 = (element_type *)((long)&peVar18[-(ulong)bVar21]._vptr_state_mgr + 4);
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar19 + (ulong)bVar21 * -8 + 4);
      }
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 0x40))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 0x40))->_M_weak_count = 0;
      context::set_params((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,
                          (ptr<raft_params> *)&local_e8);
    }
    else {
      if (sVar13 == 0) {
        if (sVar14 == 0) goto LAB_00211abb;
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12))
        {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&local_e8,
                     "2-node cluster\'s follower is lagging behind, adjust quorum to 1");
          (*peVar5->_vptr_logger[8])
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0xb0,&local_e8);
          goto LAB_00211a38;
        }
      }
      else {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12))
        {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&local_e8,
                     "2-node cluster\'s follower is not responding long time, adjust quorum to 1");
          (*peVar5->_vptr_logger[8])
                    (peVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0xac,&local_e8);
LAB_00211a38:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_unused._0_8_ != &local_d8) {
            operator_delete(local_e8._M_unused._M_object);
          }
        }
      }
      peVar18 = local_98;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = operator_new(0x78);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0061eba8;
      local_e8._M_unused._0_8_ = (undefined8)(local_e8._8_8_ + 0x10);
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_unused._0_8_;
      for (lVar17 = 0x1a; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined4 *)paVar19 = *(undefined4 *)&peVar18->_vptr_state_mgr;
        peVar18 = (element_type *)((long)&peVar18[-(ulong)bVar21]._vptr_state_mgr + 4);
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar19 + (ulong)bVar21 * -8 + 4);
      }
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 0x40))->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._8_8_ + 0x40))->_M_weak_count = 1;
      context::set_params((this->ctx_)._M_t.
                          super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                          .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl,
                          (ptr<raft_params> *)&local_e8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
  }
LAB_00211abb:
  bVar9 = peer::need_to_reconnect
                    ((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar15 = timer_helper::get_us
                     (&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                       last_active_timer_);
  uVar20 = uVar15 / 1000;
  if (DAT_0063ca10 * *(int *)&local_98[1]._vptr_state_mgr < (int)uVar20) {
    peVar6 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar6 != (element_type *)0x0) &&
       (((peVar6->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        )->id_ == ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->id_)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&local_e8,
                   "connection to peer %d is not active long time: %d ms, but this peer should be removed. do nothing"
                   ,(ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_,uVar20 & 0xffffffff);
        (*peVar5->_vptr_logger[8])
                  (peVar5,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0xd3,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_unused._0_8_ != &local_d8) {
          operator_delete(local_e8._M_unused._M_object);
        }
      }
      goto LAB_00211ba5;
    }
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&local_e8,
                 "connection to peer %d is not active long time: %d ms, force re-connect",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_,uVar20 & 0xffffffff);
      (*peVar5->_vptr_logger[8])
                (peVar5,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0xd8,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_unused._0_8_ != &local_d8) {
        operator_delete(local_e8._M_unused._M_object);
      }
    }
    timer_helper::reset(&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                         ->last_active_timer_);
LAB_00211c39:
    bVar9 = reconnect_client(this,(p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr);
    _Var7 = (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            next_log_idx_).super___atomic_base<unsigned_long>._M_i;
    if (bVar9 && _Var7 != 0) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 5 < iVar12)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar6 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&local_e8,
                   "new rpc for peer %d is created, reset next log idx (%lu) and matched log idx (%lu)"
                   ,(ulong)(uint)((peVar6->config_).
                                  super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->id_,_Var7,peVar6->matched_idx_);
        (*peVar5->_vptr_logger[8])
                  (peVar5,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0xf6,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_unused._0_8_ != &local_d8) {
          operator_delete(local_e8._M_unused._M_object);
        }
      }
      LOCK();
      (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->next_log_idx_).
      super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      ((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->matched_idx_ = 0;
    }
    LOCK();
    (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->reconn_scheduled_).
    _M_base._M_i = false;
    UNLOCK();
  }
  else {
LAB_00211ba5:
    if (bVar9) goto LAB_00211c39;
  }
  if (*(char *)((long)&local_98[0xc]._vptr_state_mgr + 4) == '\x01') {
    psVar16 = snapshot_io_mgr::instance();
    bVar9 = snapshot_io_mgr::has_pending_request
                      (psVar16,this,
                       ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                        ->config_).
                        super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       id_);
    if (bVar9) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar9 = true;
      if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 5 < iVar12)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&local_e8,"previous snapshot request for peer %d already exists",
                   (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar5->_vptr_logger[8])
                  (peVar5,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x101,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_unused._0_8_ != &local_d8) {
          operator_delete(local_e8._M_unused._M_object);
        }
      }
      goto LAB_00212572;
    }
  }
  paVar1 = &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->busy_flag_;
  LOCK();
  bVar9 = (paVar1->_M_base)._M_i == false;
  if (bVar9) {
    (paVar1->_M_base)._M_i = true;
  }
  UNLOCK();
  peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (bVar9) {
    if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 5 < iVar12)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&local_e8,"send request to %d\n",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar5->_vptr_logger[8])
                (peVar5,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0x107,&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_unused._0_8_ != &local_d8) {
        operator_delete(local_e8._M_unused._M_object);
      }
    }
    peVar6 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar6->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (peVar6->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    std::
    function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
    function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
              *)&local_e8,
             &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              rsv_msg_handler_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      create_append_entries_req((raft_server *)&local_c8,(ptr<peer> *)this);
      this_00._M_pi =
           local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
      local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_c8._M_unused._0_8_;
      local_c8._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      std::
      function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::operator=((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                   *)&local_e8,&this->resp_handler_);
    }
    else {
      peVar6 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      _local_88 = (element_type *)0x0;
      _iStack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8._M_allocated_capacity = 0;
      local_b8._8_8_ = 0;
      local_c8._M_unused._M_object =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (peVar6->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(peVar6->rsv_msg_).super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff80);
      std::
      function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::operator=(&peVar6->rsv_msg_handler_,
                  (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                   *)&local_c8);
      if ((code *)local_b8._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_b8._M_allocated_capacity)(&local_c8,&local_c8,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_iStack_80 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_iStack_80);
      }
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 3 < iVar12)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&local_c8,"found reserved message to peer %d, type %d",
                   (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_,
                   (ulong)*(uint *)((long)local_a8.
                                          super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + 0x10));
        (*peVar5->_vptr_logger[8])
                  (peVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x110,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_unused._0_8_ != &local_b8) {
          operator_delete(local_c8._M_unused._M_object);
        }
      }
    }
    peVar6 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      LOCK();
      (peVar6->busy_flag_)._M_base._M_i = false;
      UNLOCK();
      bVar9 = false;
      cVar3 = *(char *)((long)&local_98[0xc]._vptr_state_mgr + 4);
      if (cVar3 == '\x01') {
        peer::get_snapshot_sync_ctx((peer *)&local_c8);
        bVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_unused._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      }
      if ((cVar3 != '\0') &&
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      if (bVar9) {
        psVar16 = snapshot_io_mgr::instance();
        snapshot_io_mgr::invoke(psVar16);
      }
    }
    else {
      peVar8 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (((peVar6->manual_free_)._M_base._M_i & 1U) == 0) {
        if (DAT_0063ca04 <= (peVar8->long_pause_warnings_).super___atomic_base<int>._M_i) {
          uVar15 = timer_helper::get_us
                             (&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->last_sent_timer_);
          LOCK();
          paVar2 = &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    network_recoveries_;
          (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
          UNLOCK();
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12)
             ) {
            peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            peVar6 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&local_c8,
                       "recovered from long pause to peer %d, %d warnings, %d ms, %d times",
                       (ulong)(uint)((peVar6->config_).
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_,
                       (ulong)(uint)(peVar6->long_pause_warnings_).super___atomic_base<int>._M_i,
                       uVar15 / 1000 & 0xffffffff,
                       (ulong)(uint)(((p->
                                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->network_recoveries_).super___atomic_base<int>._M_i);
            (*peVar5->_vptr_logger[8])
                      (peVar5,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"request_append_entries",0x12e,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_unused._0_8_ != &local_b8) {
              operator_delete(local_c8._M_unused._M_object);
            }
          }
          if (9 < (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  network_recoveries_).super___atomic_base<int>._M_i) {
            LOCK();
            (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            network_recoveries_).super___atomic_base<int>._M_i = 0;
            UNLOCK();
          }
        }
        LOCK();
        (((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        long_pause_warnings_).super___atomic_base<int>._M_i = 0;
        UNLOCK();
      }
      else {
        LOCK();
        (peVar8->manual_free_)._M_base._M_i = false;
        UNLOCK();
      }
      local_60._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_58._M_pi =
           (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
        }
      }
      peer::send_req((peer *)local_60._M_pi,(ptr<peer> *)&stack0xffffffffffffffa0,&local_a8,
                     (rpc_handler *)&local_e8);
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
      timer_helper::reset(&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           )->last_sent_timer_);
      _Stack_84 = (this->leader_).super___atomic_base<int>._M_i;
      local_88 = this->id_;
      iStack_80 = ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->id_;
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar4 = (this->ctx_)._M_t.
               super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
               super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
               super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
      if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
        local_4c = SentAppendEntriesReq;
        local_c8._M_unused._M_object = &stack0xffffffffffffff78;
        (*(pcVar4->cb_func_).func._M_invoker)
                  ((_Any_data *)&pcVar4->cb_func_,&stack0xffffffffffffffb4,(Param **)&local_c8);
      }
      peVar6 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((((peVar6 != (element_type *)0x0) &&
           (((peVar6->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->id_ ==
            ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->config_).
             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->id_)) &&
          (this->srv_to_leave_target_idx_ <=
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 0x30))->_M_allocated_capacity)) &&
         (((peVar6->stepping_down_)._M_base._M_i & 1U) == 0)) {
        LOCK();
        (((this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->stepping_down_)._M_base._M_i = true;
        UNLOCK();
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 3 < iVar12))
        {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&local_c8,
                     "srv_to_leave_ %d is safe to be erased from peer list, log idx %lu commit idx %lu, set flag"
                     ,(ulong)(uint)((((this->srv_to_leave_).
                                      super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->config_).
                                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->id_,
                     *(undefined8 *)
                      ((long)local_a8.
                             super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 0x28),((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)local_a8.
                                         super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + 0x30))->_M_allocated_capacity);
          (*peVar5->_vptr_logger[8])
                    (peVar5,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"request_append_entries",0x153,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_unused._0_8_ != &local_b8) {
            operator_delete(local_c8._M_unused._M_object);
          }
        }
      }
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 5 < iVar12)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)&local_c8,"sent\n");
        (*peVar5->_vptr_logger[8])
                  (peVar5,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x156,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_unused._0_8_ != &local_b8) {
          operator_delete(local_c8._M_unused._M_object);
        }
      }
    }
    if ((code *)local_d8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_d8._M_allocated_capacity)(&local_e8,&local_e8,3);
    }
    if (local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar9 = true;
    goto LAB_00212572;
  }
  if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 4 < iVar12)) {
    peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              ((string *)&local_e8,"Server %d is busy, skip the request",
               (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->config_).
                             super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->id_);
    (*peVar5->_vptr_logger[8])
              (peVar5,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"request_append_entries",0x15a,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_unused._0_8_ != &local_d8) {
      operator_delete(local_e8._M_unused._M_object);
    }
  }
  local_70._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68._M_pi =
       (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  check_snapshot_timeout(this,(ptr<peer> *)&stack0xffffffffffffff90);
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  uVar15 = timer_helper::get_us
                     (&((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                       last_sent_timer_);
  if (*(int *)&local_98[1]._vptr_state_mgr < (int)(uVar15 / 1000)) {
    LOCK();
    paVar2 = &((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              long_pause_warnings_;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    if ((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        long_pause_warnings_).super___atomic_base<int>._M_i < DAT_0063ca04) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar5 != (element_type *)0x0) && (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12)) {
        peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&local_e8,
                   "skipped sending msg to %d too long time, last msg sent %d ms ago",
                   (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr)->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_,uVar15 / 1000 & 0xffffffff);
        (*peVar5->_vptr_logger[8])
                  (peVar5,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"request_append_entries",0x164,&local_e8);
LAB_00212358:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_unused._0_8_ != &local_d8) {
          operator_delete(local_e8._M_unused._M_object);
        }
      }
    }
    else if ((((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               long_pause_warnings_).super___atomic_base<int>._M_i == DAT_0063ca04) &&
             (peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr, peVar5 != (element_type *)0x0)) &&
            (iVar12 = (*peVar5->_vptr_logger[7])(), 2 < iVar12)) {
      peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&local_e8,
                 "long pause warning to %d is too verbose, will suppress it from now",
                 (ulong)(uint)((((p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->config_).
                               super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->id_);
      (*peVar5->_vptr_logger[8])
                (peVar5,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"request_append_entries",0x169,&local_e8);
      goto LAB_00212358;
    }
  }
  bVar9 = false;
LAB_00212572:
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  return bVar9;
}

Assistant:

bool raft_server::request_append_entries(ptr<peer> p) {
    static timer_helper chk_timer(1000*1000);

    // Checking the validity of role first.
    if (role_ != srv_role::leader) {
        // WARNING: We should allow `write_paused_` state for
        //          graceful resignation.
        return false;
    }

    cb_func::Param cb_param(id_, leader_, p->get_id());
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::RequestAppendEntries, &cb_param);
    if (rc == CbReturnCode::ReturnNull) {
        p_wn("by callback, abort request_append_entries");
        return true;
    }

    ptr<raft_params> params = ctx_->get_params();

    if ( params->auto_adjust_quorum_for_small_cluster_ &&
         get_num_voting_members() == 2 &&
         chk_timer.timeout_and_reset() ) {
        // If auto adjust mode is on for 2-node cluster, and
        // the follower is not responding, adjust the quorum.
        size_t num_not_responding_peers = get_not_responding_peers();
        size_t cur_quorum_size = get_quorum_for_commit();
        size_t num_stale_peers = get_num_stale_peers();
        if (cur_quorum_size >= 1) {
            bool do_adjustment = false;
            if (num_not_responding_peers) {
                p_wn("2-node cluster's follower is not responding long time, "
                     "adjust quorum to 1");
                do_adjustment = true;
            } else if (num_stale_peers) {
                p_wn("2-node cluster's follower is lagging behind, "
                     "adjust quorum to 1");
                do_adjustment = true;
            }
            if (do_adjustment) {
                ptr<raft_params> clone = cs_new<raft_params>(*params);
                clone->custom_commit_quorum_size_ = 1;
                clone->custom_election_quorum_size_ = 1;
                ctx_->set_params(clone);
            }

        } else if ( num_not_responding_peers == 0 &&
                    num_stale_peers == 0 &&
                    params->custom_commit_quorum_size_ == 1 ) {
            // Recovered, both cases should be clear.
            p_wn("2-node cluster's follower is responding now, "
                 "restore quorum with default value");
            ptr<raft_params> clone = cs_new<raft_params>(*params);
            clone->custom_commit_quorum_size_ = 0;
            clone->custom_election_quorum_size_ = 0;
            ctx_->set_params(clone);
        }
    }

    bool need_to_reconnect = p->need_to_reconnect();
    int32 last_active_time_ms = p->get_active_timer_us() / 1000;
    if ( last_active_time_ms >
             params->heart_beat_interval_ *
                 raft_server::raft_limits_.reconnect_limit_ ) {
        if (srv_to_leave_ && srv_to_leave_->get_id() == p->get_id()) {
            // We should not re-establish the connection to
            // to-be-removed server, as it will block removing it
            // from `peers_` list.
            p_wn( "connection to peer %d is not active long time: %d ms, "
                  "but this peer should be removed. do nothing",
                  p->get_id(),
                  last_active_time_ms );
        } else {
            p_wn( "connection to peer %d is not active long time: %d ms, "
                  "force re-connect",
                  p->get_id(),
                  last_active_time_ms );
            need_to_reconnect = true;
            p->reset_active_timer();
        }
    }
    if (need_to_reconnect) {
        bool reconnected = reconnect_client(*p);
        uint64_t p_next_log_idx = p->get_next_log_idx();
        if (reconnected && p_next_log_idx) {
            // NOTE:
            //   Discussions in https://github.com/eBay/NuRaft/issues/181
            //
            //   The leader keeps the last sent log info for each peer
            //   and sends the next `append_entries` request based on
            //   that data. This process disrupts offline data change,
            //   such as snapshot install, as the leader's peer info
            //   remains unchanged and results in wrong decisions. The
            //   right way to do this is to remove the node, install
            //   the snapshot, and then add the node back.
            //
            //   To avoid those hassles, we can reset the peer info that
            //   the leader has. Once any disconnection happens to a
            //   peer, we reset the last sent log info. The log info will
            //   be re-adjusted by the first `append_entries`
            //   communication between the leader and the peer. It will
            //   eventually have the same impact of removing and then
            //   re-adding the peer.
            //
            p_tr("new rpc for peer %d is created, "
                 "reset next log idx (%" PRIu64 ") and matched log idx (%" PRIu64 ")",
                 p->get_id(), p_next_log_idx, p->get_matched_idx());
            p->set_next_log_idx(0);
            p->set_matched_idx(0);
        }
        p->clear_reconnection();
    }

    if (params->use_bg_thread_for_snapshot_io_) {
        // Check the current queue if previous request exists.
        if (snapshot_io_mgr::instance().has_pending_request(this, p->get_id())) {
            p_tr( "previous snapshot request for peer %d already exists",
                  p->get_id() );
            return true;
        }
    }

    if (p->make_busy()) {
        p_tr("send request to %d\n", (int)p->get_id());

        // If reserved message exists, process it first.
        ptr<req_msg> msg = p->get_rsv_msg();
        rpc_handler m_handler = p->get_rsv_msg_handler();
        if (msg) {
            // Clear the reserved message.
            p->set_rsv_msg(nullptr, nullptr);
            p_in("found reserved message to peer %d, type %d",
                 p->get_id(), msg->get_type());

        } else {
            // Normal message.
            msg = create_append_entries_req(p);
            m_handler = resp_handler_;
        }

        if (!msg) {
            // Even normal message doesn't exist.
            p->set_free();
            if ( params->use_bg_thread_for_snapshot_io_ &&
                 p->get_snapshot_sync_ctx() ) {
                // If this is an async snapshot request, invoke IO thread.
                snapshot_io_mgr::instance().invoke();
            }
            return true;
        }

        if (!p->is_manual_free()) {
            // Actual recovery.
            if ( p->get_long_puase_warnings() >=
                     raft_server::raft_limits_.warning_limit_ ) {
                int32 last_ts_ms = p->get_ls_timer_us() / 1000;
                p->inc_recovery_cnt();
                p_wn( "recovered from long pause to peer %d, %d warnings, "
                      "%d ms, %d times",
                      p->get_id(),
                      p->get_long_puase_warnings(),
                      last_ts_ms,
                      p->get_recovery_cnt() );

                if (p->get_recovery_cnt() >= 10) {
                    // Re-connect client, just in case.
                    //reconnect_client(*p);
                    p->reset_recovery_cnt();
                }
            }
            p->reset_long_pause_warnings();

        } else {
            // FIXME: `manual_free` is deprecated, need to get rid of it.

            // It means that this is not an actual recovery,
            // but just temporarily freed busy flag.
            p->reset_manual_free();
        }

        p->send_req(p, msg, m_handler);
        p->reset_ls_timer();

        cb_func::Param param(id_, leader_, p->get_id(), msg.get());
        ctx_->cb_func_.call(cb_func::SentAppendEntriesReq, &param);

        if ( srv_to_leave_ &&
             srv_to_leave_->get_id() == p->get_id() &&
             msg->get_commit_idx() >= srv_to_leave_target_idx_ &&
             !srv_to_leave_->is_stepping_down() ) {
            // If this is the server to leave, AND
            // current request's commit index includes
            // the target log index number, step down and remove it
            // as soon as we get the corresponding response.
            srv_to_leave_->step_down();
            p_in("srv_to_leave_ %d is safe to be erased from peer list, "
                 "log idx %" PRIu64 " commit idx %" PRIu64 ", set flag",
                 srv_to_leave_->get_id(),
                 msg->get_last_log_idx(),
                 msg->get_commit_idx());
        }

        p_tr("sent\n");
        return true;
    }

    p_db("Server %d is busy, skip the request", p->get_id());
    check_snapshot_timeout(p);

    int32 last_ts_ms = p->get_ls_timer_us() / 1000;
    if ( last_ts_ms > params->heart_beat_interval_ ) {
        // Waiting time becomes longer than HB interval, warning.
        p->inc_long_pause_warnings();
        if (p->get_long_puase_warnings() < raft_server::raft_limits_.warning_limit_) {
            p_wn("skipped sending msg to %d too long time, "
                 "last msg sent %d ms ago",
                 p->get_id(), last_ts_ms);

        } else if ( p->get_long_puase_warnings() ==
                        raft_server::raft_limits_.warning_limit_ ) {
            p_wn("long pause warning to %d is too verbose, "
                 "will suppress it from now", p->get_id());
        }
    }
    return false;
}